

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mul.c
# Opt level: O2

word zzModW(word *a,size_t n,word w)

{
  word r;
  word wVar1;
  bool bVar2;
  
  wVar1 = 0;
  while (bVar2 = n != 0, n = n - 1, bVar2) {
    wVar1 = __umodti3(a[n],wVar1,w,0);
  }
  return wVar1;
}

Assistant:

word zzModW(const word a[], size_t n, register word w)
{
	register word r = 0;
	register dword divisor;
	ASSERT(w > 0);
	ASSERT(wwIsValid(a, n));
	while (n--)
	{
		divisor = r;
		divisor <<= B_PER_W;
		divisor |= a[n];
		r = (word)(divisor % w);
	}
	divisor = 0, w = 0;
	return r;
}